

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaResolveAttrGroupReferences(xmlSchemaQNameRefPtr ref,xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaAttributeGroupPtr_conflict pxVar1;
  xmlSchemaAttributeGroupPtr_conflict group;
  xmlSchemaParserCtxtPtr ctxt_local;
  xmlSchemaQNameRefPtr ref_local;
  
  if (ref->item == (xmlSchemaBasicItemPtr)0x0) {
    pxVar1 = xmlSchemaGetAttributeGroup(ctxt->schema,ref->name,ref->targetNamespace);
    if (pxVar1 == (xmlSchemaAttributeGroupPtr_conflict)0x0) {
      xmlSchemaPResCompAttrErr
                (ctxt,XML_SCHEMAP_SRC_RESOLVE,(xmlSchemaBasicItemPtr)0x0,ref->node,"ref",ref->name,
                 ref->targetNamespace,ref->itemType,(char *)0x0);
      ref_local._4_4_ = ctxt->err;
    }
    else {
      ref->item = (xmlSchemaBasicItemPtr)pxVar1;
      ref_local._4_4_ = 0;
    }
  }
  else {
    ref_local._4_4_ = 0;
  }
  return ref_local._4_4_;
}

Assistant:

static int
xmlSchemaResolveAttrGroupReferences(xmlSchemaQNameRefPtr ref,
				    xmlSchemaParserCtxtPtr ctxt)
{
    xmlSchemaAttributeGroupPtr group;

    if (ref->item != NULL)
        return(0);
    group = xmlSchemaGetAttributeGroup(ctxt->schema,
	ref->name,
	ref->targetNamespace);
    if (group == NULL) {
	xmlSchemaPResCompAttrErr(ctxt,
	    XML_SCHEMAP_SRC_RESOLVE,
	    NULL, ref->node,
	    "ref", ref->name, ref->targetNamespace,
	    ref->itemType, NULL);
	return(ctxt->err);
    }
    ref->item = WXS_BASIC_CAST group;
    return(0);
}